

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_rawsetp(lua_State *L,int idx,void *p)

{
  StkId pTVar1;
  TValue *pTVar2;
  TValue *io1;
  TValue *io2;
  TValue *io;
  TValue k;
  StkId t;
  void *p_local;
  int idx_local;
  lua_State *L_local;
  
  k._8_8_ = index2addr(L,idx);
  k.value_.b = 2;
  pTVar1 = L->top;
  io = (TValue *)p;
  pTVar2 = luaH_set(L,&((((TValue *)k._8_8_)->value_).gc)->h,(TValue *)&io);
  pTVar2->value_ = pTVar1[-1].value_;
  pTVar2->tt_ = pTVar1[-1].tt_;
  if ((((L->top[-1].tt_ & 0x40U) != 0) && (((byte)L->top[-1].value_.f[9] & 3) != 0)) &&
     ((*(byte *)(*(long *)k._8_8_ + 9) & 4) != 0)) {
    luaC_barrierback_(L,*(GCObject **)k._8_8_);
  }
  L->top = L->top + -1;
  return;
}

Assistant:

LUA_API void lua_rawsetp (lua_State *L, int idx, const void *p) {
  StkId t;
  TValue k;
  lua_lock(L);
  api_checknelems(L, 1);
  t = index2addr(L, idx);
  api_check(L, ttistable(t), "table expected");
  setpvalue(&k, cast(void *, p));
  setobj2t(L, luaH_set(L, hvalue(t), &k), L->top - 1);
  luaC_barrierback(L, gcvalue(t), L->top - 1);
  L->top--;
  lua_unlock(L);
}